

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitSelect
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,Select *curr
          )

{
  char **__return_storage_ptr___00;
  int32_t iVar1;
  Literal *this_00;
  Flow *pFVar2;
  undefined1 local_108 [8];
  Flow ifTrue;
  Flow ifFalse;
  Flow condition;
  
  visit((Flow *)local_108,this,curr->ifTrue);
  if (ifTrue.breakTo.super_IString.str._M_len == 0) {
    __return_storage_ptr___00 = &ifTrue.breakTo.super_IString.str._M_str;
    visit((Flow *)__return_storage_ptr___00,this,curr->ifFalse);
    if (ifFalse.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)&ifFalse.breakTo.super_IString.str._M_str,this,curr->condition);
      if (condition.breakTo.super_IString.str._M_len == 0) {
        this_00 = Flow::getSingleValue((Flow *)&ifFalse.breakTo.super_IString.str._M_str);
        iVar1 = Literal::geti32(this_00);
        pFVar2 = (Flow *)local_108;
        if (iVar1 == 0) {
          pFVar2 = (Flow *)__return_storage_ptr___00;
        }
        Flow::Flow(__return_storage_ptr__,pFVar2);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&ifFalse.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&ifFalse.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ifTrue.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ifTrue.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_108);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_108);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSelect(Select* curr) {
    NOTE_ENTER("Select");
    Flow ifTrue = visit(curr->ifTrue);
    if (ifTrue.breaking()) {
      return ifTrue;
    }
    Flow ifFalse = visit(curr->ifFalse);
    if (ifFalse.breaking()) {
      return ifFalse;
    }
    Flow condition = visit(curr->condition);
    if (condition.breaking()) {
      return condition;
    }
    NOTE_EVAL1(condition.getSingleValue());
    return condition.getSingleValue().geti32() ? ifTrue : ifFalse; // ;-)
  }